

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovEntries.cpp
# Opt level: O1

cl_context
clCreateContext(cl_context_properties *properties,cl_uint num_devices,cl_device_id *devices,
               _func_void_char_ptr_void_ptr_size_t_void_ptr *pfn_notify,void *user_data,
               cl_int *errcode_ret)

{
  cl_context p_Var1;
  bool bVar2;
  cl_int cVar3;
  long *plVar4;
  ulong uVar5;
  Platform *obj;
  long lVar6;
  bool bVar7;
  
  if (properties != (cl_context_properties *)0x0) {
    lVar6 = *properties;
    bVar7 = lVar6 == 0;
    if (!bVar7) {
      plVar4 = properties + 2;
      bVar2 = false;
      cVar3 = -0x40;
      do {
        if ((lVar6 != 0x1084) || (bVar2)) {
LAB_001027f8:
          *errcode_ret = cVar3;
          if (!bVar7) {
            return (cl_context)0x0;
          }
          break;
        }
        if (*(char *)(plVar4[-1] + 8) != '\x01') {
          cVar3 = -0x20;
          goto LAB_001027f8;
        }
        lVar6 = *plVar4;
        plVar4 = plVar4 + 2;
        bVar2 = true;
        bVar7 = lVar6 == 0;
      } while (!bVar7);
    }
  }
  if ((num_devices == 0 || devices == (cl_device_id *)0x0) ||
     (pfn_notify == (_func_void_char_ptr_void_ptr_size_t_void_ptr *)0x0 && user_data != (void *)0x0)
     ) {
    *errcode_ret = -0x1e;
    return (cl_context)0x0;
  }
  bVar7 = num_devices != 0;
  if (bVar7) {
    if ((*devices)[8] == (_cl_device_id)0x2) {
      uVar5 = 0;
      do {
        if ((ulong)num_devices - 1 == uVar5) goto LAB_0010286c;
        lVar6 = uVar5 + 1;
        uVar5 = uVar5 + 1;
      } while (devices[lVar6][8] == (_cl_device_id)0x2);
      bVar7 = uVar5 < num_devices;
    }
    *errcode_ret = -0x21;
    if (bVar7) {
      return (cl_context)0x0;
    }
  }
LAB_0010286c:
  p_Var1 = cov::createContext(properties,num_devices,devices,pfn_notify,user_data,errcode_ret);
  return p_Var1;
}

Assistant:

CL_API_ENTRY cl_context CL_API_CALL
clCreateContext(const cl_context_properties* properties,
                cl_uint num_devices,
                const cl_device_id* devices,
                void (CL_CALLBACK* pfn_notify)(const char* errinfo,
                                               const void* private_info,
                                               size_t cb,
                                               void* user_data),
                void* user_data,
                cl_int* errcode_ret) CL_API_SUFFIX__VERSION_1_0
{
    if (properties) {
        uint32_t i = 0;
        bool hasPlatformProperties = false;
        while (properties[i] != 0) {
            if (properties[i] == CL_CONTEXT_PLATFORM) {
                if (hasPlatformProperties) {
                    *errcode_ret = CL_INVALID_PROPERTY;
                    return nullptr;
                }
                if (!cov::isValidObject<cov::Platform>(reinterpret_cast<void*>(properties[i + 1]))) {
                    *errcode_ret = CL_INVALID_PLATFORM;
                    return nullptr;
                }
                hasPlatformProperties = true; // platform here not actually used
            } else {
                *errcode_ret = CL_INVALID_PROPERTY;
                return nullptr;
            }
            i += 2;
        }
    }
    if (!devices || num_devices == 0) {
        *errcode_ret = CL_INVALID_VALUE;
        return nullptr;
    }
    if (!pfn_notify && user_data) {
        *errcode_ret = CL_INVALID_VALUE;
        return nullptr;
    }
    for (cl_uint i = 0; i < num_devices; i++) {
        if (!cov::isValidObject<cov::Device>(devices[i])) {
            *errcode_ret = CL_INVALID_DEVICE;
            return nullptr;
        }
    }

    return cov::createContext(properties, num_devices, devices, pfn_notify, user_data, errcode_ret);
}